

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O2

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenOctNum(Lexer *this)

{
  Lexer *in_RSI;
  
  nextChar(in_RSI);
  while ((in_RSI->currentChar & 0xfffffff8U) == 0x30) {
    nextChar(in_RSI);
  }
  nextTokenNumType(this,(uint64_t)in_RSI);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenOctNum() noexcept {
  nextChar(); // eat o

  size_t num = 0;
  while (currentChar >= '0' && currentChar <= '7') {
    num *= 8;
    num += currentChar - '0';
    nextChar(); // eat octal digit
  }

  return nextTokenNumType(num);
}